

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

void __thiscall Kernel::AppliedTerm::AppliedTerm(AppliedTerm *this,TermList t,AppliedTerm parent)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t in_RSI;
  uint64_t *in_RDI;
  byte in_stack_00000010;
  long *in_stack_00000018;
  byte local_31;
  TermList *in_stack_ffffffffffffffd0;
  TermList *this_00;
  TermList local_8;
  
  local_8._content = in_RSI;
  if (((in_stack_00000010 & 1) == 0) ||
     (bVar2 = TermList::isVar(in_stack_ffffffffffffffd0), plVar1 = in_stack_00000018, !bVar2)) {
    *in_RDI = local_8._content;
  }
  else {
    uVar3 = TermList::var(&local_8);
    uVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,uVar3);
    *in_RDI = uVar4;
  }
  this_00 = (TermList *)(in_RDI + 1);
  if (((in_stack_00000010 & 1) == 0) || (bVar2 = TermList::isVar(this_00), !bVar2)) {
    local_31 = in_stack_00000010;
  }
  else {
    local_31 = 0;
  }
  *(byte *)&this_00->_content = local_31 & 1;
  in_RDI[2] = (uint64_t)in_stack_00000018;
  return;
}

Assistant:

AppliedTerm(TermList t, AppliedTerm parent)
    : term(parent.aboveVar && t.isVar() ? (*parent.applicator)(t.var()) : t),
      aboveVar(parent.aboveVar && t.isVar() ? false : parent.aboveVar), applicator(parent.applicator) {}